

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  IStreamingReporter *pIVar1;
  int iVar2;
  bool bVar3;
  
  pIVar1 = (this->m_reporter).m_ptr;
  if (pIVar1 == (IStreamingReporter *)0x0) {
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                  ,0x4b8,
                  "T *Catch::Detail::unique_ptr<Catch::IStreamingReporter>::operator->() const [T = Catch::IStreamingReporter]"
                 );
  }
  (*pIVar1->_vptr_IStreamingReporter[0xc])();
  bVar3 = SUB41((info->resultDisposition & FalseTest) >> 2,0);
  if (bVar3 != expr->m_result) {
    if (this->m_includeSuccessfulResults != false) {
      reportExpr(this,info,Ok,expr,bVar3);
      return;
    }
    (*(this->super_IResultCapture)._vptr_IResultCapture[0x15])(this);
    return;
  }
  reportExpr(this,info,ExpressionFailed,expr,bVar3);
  iVar2 = (*this->m_config->_vptr_IConfig[6])();
  reaction->shouldDebugBreak = SUB41(iVar2,0);
  iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[0x19])(this);
  bVar3 = true;
  if ((char)iVar2 == '\0') {
    bVar3 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
  }
  reaction->shouldThrow = bVar3;
  return;
}

Assistant:

void RunContext::handleExpr(
        AssertionInfo const &info,
        ITransientExpression const &expr,
        AssertionReaction &reaction
    ) {
        m_reporter->assertionStarting(info);

        bool negated = isFalseTest(info.resultDisposition);
        bool result = expr.getResult() != negated;

        if (result) {
            if (!m_includeSuccessfulResults) {
                assertionPassed();
            }
            else {
                reportExpr(info, ResultWas::Ok, &expr, negated);
            }
        }
        else {
            reportExpr(info, ResultWas::ExpressionFailed, &expr, negated);
            populateReaction(reaction);
        }
    }